

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ExprNode * __thiscall Parser::sub(Parser *this)

{
  ExprNode *pEVar1;
  undefined8 extraout_RAX;
  Token closeBrace;
  Token openBrace;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  Token local_100;
  Token local_90;
  
  Tokenizer::getToken(&local_90,this->tokenizer);
  if (local_90._symbol == '[') {
    pEVar1 = exprOrTest(this);
    Tokenizer::getToken(&local_100,this->tokenizer);
    if (local_100._symbol == ']') {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._string._M_dataplus._M_p != &local_100._string.field_2) {
        operator_delete(local_100._string._M_dataplus._M_p,
                        local_100._string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._relOp._M_dataplus._M_p != &local_100._relOp.field_2) {
        operator_delete(local_100._relOp._M_dataplus._M_p,
                        local_100._relOp.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._name._M_dataplus._M_p != &local_100._name.field_2) {
        operator_delete(local_100._name._M_dataplus._M_p,
                        local_100._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._string._M_dataplus._M_p != &local_90._string.field_2) {
        operator_delete(local_90._string._M_dataplus._M_p,
                        local_90._string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._relOp._M_dataplus._M_p != &local_90._relOp.field_2) {
        operator_delete(local_90._relOp._M_dataplus._M_p,
                        local_90._relOp.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._name._M_dataplus._M_p != &local_90._name.field_2) {
        operator_delete(local_90._name._M_dataplus._M_p,
                        local_90._name.field_2._M_allocated_capacity + 1);
      }
      return pEVar1;
    }
  }
  else {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120.field_2._M_allocated_capacity._0_7_ = 0x3a726573726150;
    local_120.field_2._7_4_ = 0x6275733a;
    local_120._M_string_length = 0xb;
    local_120.field_2._M_local_buf[0xb] = '\0';
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,"Expected an [ sign, instead got","");
    die(this,&local_120,&local_160,&local_90);
  }
  local_140.field_2._M_allocated_capacity._0_7_ = 0x3a726573726150;
  local_140.field_2._7_4_ = 0x6275733a;
  local_140._M_string_length = 0xb;
  local_140.field_2._M_local_buf[0xb] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"Expected an ] sign, instead got","");
  die(this,&local_140,&local_180,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT17(local_140.field_2._M_local_buf[7],
                             local_140.field_2._M_allocated_capacity._0_7_) + 1);
  }
  Token::~Token(&local_100);
  Token::~Token(&local_90);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

ExprNode *Parser::sub() {
    Token openBrace = tokenizer.getToken();
    if (!openBrace.isOpenBrace())
        die("Parser::sub", "Expected an [ sign, instead got", openBrace);
    ExprNode *subTest = test();
    Token closeBrace = tokenizer.getToken();
    if (!closeBrace.isCloseBrace())
        die("Parser::sub", "Expected an ] sign, instead got", closeBrace);
    return subTest;

}